

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void lest::inform(location *where,text *expr)

{
  undefined8 uVar1;
  char unaff_BPL;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [96];
  string local_80 [80];
  
  uVar1 = __cxa_rethrow();
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_80);
  if (unaff_BPL != '\0') {
    __cxa_free_exception();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

inline void inform( location where, text expr )
{
    try
    {
        throw;
    }
    catch( failure const & )
    {
        throw;
    }
    catch( std::exception const & e )
    {
        throw unexpected( where, expr, with_message( e.what() ) ); \
    }
    catch(...)
    {
        throw unexpected( where, expr, "of unknown type" ); \
    }
}